

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

bool __thiscall
Clasp::SharedMinimizeData::imp
          (SharedMinimizeData *this,wsum_t *lhs,LevelWeight *w,wsum_t *rhs,uint32 *lev)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  long lVar4;
  
  bVar3 = (byte)rhs;
  uVar2 = *lev;
  while ((uVar2 != (*(uint *)w & 0x7fffffff) && (lhs[uVar2] == rhs[uVar2]))) {
    uVar2 = uVar2 + 1;
    *lev = uVar2;
  }
  do {
    if (uVar2 == (this->adjust_).ebo_.size) {
      bVar1 = 0;
LAB_00150085:
      return (bool)(bVar1 & bVar3);
    }
    lVar4 = lhs[uVar2];
    if (uVar2 == (*(uint *)w & 0x7fffffff)) {
      lVar4 = lVar4 + w->weight;
      w = w + (*(uint *)w >> 0x1f);
    }
    if (lVar4 != rhs[uVar2]) {
      bVar3 = rhs[uVar2] < lVar4;
      bVar1 = 1;
      goto LAB_00150085;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool SharedMinimizeData::imp(wsum_t* lhs, const LevelWeight* w, const wsum_t* rhs, uint32& lev) const {
	assert(lev <= w->level && std::equal(lhs, lhs+lev, rhs));
	while (lev != w->level && lhs[lev] == rhs[lev]) { ++lev; }
	for (uint32 i = lev, end = numRules(); i != end; ++i) {
		wsum_t temp = lhs[i];
		if (i == w->level) { temp += w->weight; if (w->next) ++w; }
		if (temp != rhs[i]){ return temp > rhs[i]; }
	}
	return false;
}